

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

void P_DoNewChaseDir(AActor *actor,double deltax,double deltay)

{
  byte bVar1;
  dirtype_t dVar2;
  bool bVar3;
  dirtype_t dVar4;
  int iVar5;
  dirtype_t dVar6;
  uint uVar7;
  dirtype_t dVar8;
  dirtype_t dVar9;
  long lVar10;
  ulong uVar11;
  bool bStack_51;
  bool attempts [8];
  
  attempts[0] = false;
  attempts[1] = false;
  attempts[2] = false;
  attempts[3] = false;
  attempts[4] = false;
  attempts[5] = false;
  attempts[6] = false;
  attempts[7] = false;
  bVar1 = actor->movedir;
  dVar2 = opposite[bVar1];
  dVar6 = DI_EAST;
  bVar3 = true;
  if (deltax <= 10.0) {
    if (-10.0 <= deltax) {
      dVar6 = DI_NODIR;
      bVar3 = false;
    }
    else {
      dVar6 = DI_WEST;
    }
  }
  if (-10.0 <= deltay) {
    if (10.0 < deltay) {
      dVar9 = DI_NORTH;
      goto LAB_003fbcde;
    }
    dVar9 = DI_NODIR;
  }
  else {
    dVar9 = DI_SOUTH;
LAB_003fbcde:
    if (bVar3) {
      dVar8 = *(dirtype_t *)
               ((long)diags + (ulong)((uint)(0.0 < deltax) * 4 + (uint)(deltay < 0.0) * 8));
      dVar4 = dVar8 & 0xff;
      actor->movedir = (BYTE)dVar8;
      if (dVar4 != dVar2) {
        attempts[dVar4] = true;
        bVar3 = P_TryWalk(actor);
        if (bVar3) {
          return;
        }
      }
    }
  }
  if (((actor->flags5).Value & 0x20) == 0) {
    iVar5 = FRandom::operator()(&pr_newchasedir);
    if ((200 < iVar5) || (dVar8 = dVar9, ABS(deltax) < ABS(deltay))) {
      dVar8 = dVar6;
      dVar6 = dVar9;
    }
    dVar9 = DI_NODIR;
    if (dVar8 != dVar2) {
      dVar9 = dVar8;
    }
    if (dVar6 == dVar2) goto LAB_003fbdda;
  }
  if ((dVar6 != DI_NODIR) && (attempts[dVar6] == false)) {
    actor->movedir = (BYTE)dVar6;
    attempts[dVar6] = true;
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
LAB_003fbdda:
  if ((dVar9 != DI_NODIR) && (attempts[dVar9] == false)) {
    actor->movedir = (BYTE)dVar9;
    attempts[dVar9] = true;
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  if (((bVar1 != 8) && (((actor->flags5).Value & 0x20) == 0)) && (attempts[bVar1] == false)) {
    actor->movedir = bVar1;
    attempts[bVar1] = true;
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  uVar7 = FRandom::operator()(&pr_newchasedir);
  if ((uVar7 & 1) == 0) {
    for (lVar10 = 7; lVar10 != -1; lVar10 = lVar10 + -1) {
      if (((int)dVar2 != lVar10) && (attempts[lVar10] == false)) {
        actor->movedir = (BYTE)lVar10;
        attempts[lVar10] = true;
        bVar3 = P_TryWalk(actor);
        if (bVar3) {
          return;
        }
      }
    }
  }
  else {
    for (uVar11 = 0; uVar11 != 8; uVar11 = uVar11 + 1) {
      if ((dVar2 != uVar11) && (attempts[uVar11] == false)) {
        actor->movedir = (BYTE)uVar11;
        attempts[uVar11] = true;
        bVar3 = P_TryWalk(actor);
        if (bVar3) {
          return;
        }
      }
    }
  }
  if ((dVar2 != DI_NODIR) && (attempts[dVar2] == false)) {
    actor->movedir = (BYTE)dVar2;
    bVar3 = P_TryWalk(actor);
    if (bVar3) {
      return;
    }
  }
  actor->movedir = '\b';
  return;
}

Assistant:

void P_DoNewChaseDir (AActor *actor, double deltax, double deltay)
{
	dirtype_t	d[2];
	int			tdir;
	dirtype_t	olddir, turnaround;
	bool		attempts[NUMDIRS-1]; // We don't need to attempt DI_NODIR.

	memset(&attempts, false, sizeof(attempts));
	olddir = (dirtype_t)actor->movedir;
	turnaround = opposite[olddir];

	if (deltax > 10)
		d[0] = DI_EAST;
	else if (deltax < -10)
		d[0] = DI_WEST;
	else
		d[0] = DI_NODIR;

	if (deltay < -10)
		d[1] = DI_SOUTH;
	else if (deltay>10)
		d[1] = DI_NORTH;
	else
		d[1] = DI_NODIR; 

	// try direct route
	if (d[0] != DI_NODIR && d[1] != DI_NODIR)
	{
		actor->movedir = diags[((deltay<0)<<1) + (deltax>0)];
		if (actor->movedir != turnaround)
		{
			attempts[actor->movedir] = true;
			if (P_TryWalk(actor))
				return;
		}
	}

	// try other directions
	if (!(actor->flags5 & MF5_AVOIDINGDROPOFF))
	{
		if ((pr_newchasedir() > 200 || fabs(deltay) > fabs(deltax)))
		{
			swapvalues (d[0], d[1]);
		}

		if (d[0] == turnaround)
			d[0] = DI_NODIR;
		if (d[1] == turnaround)
			d[1] = DI_NODIR;
	}
		
	if (d[0] != DI_NODIR && attempts[d[0]] == false)
	{
		actor->movedir = d[0];
		attempts[d[0]] = true;
		if (P_TryWalk (actor))
		{
			// either moved forward or attacked
			return;
		}
	}

	if (d[1] != DI_NODIR && attempts[d[1]] == false)
	{
		actor->movedir = d[1];
		attempts[d[1]] = true;
		if (P_TryWalk (actor))
			return;
	}

	if (!(actor->flags5 & MF5_AVOIDINGDROPOFF))
	{
		// there is no direct path to the player, so pick another direction.
		if (olddir != DI_NODIR && attempts[olddir] == false)
		{
			actor->movedir = olddir;
			attempts[olddir] = true;
			if (P_TryWalk (actor))
				return;
		}
	}

	// randomly determine direction of search
	if (pr_newchasedir() & 1)	
	{
		for (tdir = DI_EAST; tdir <= DI_SOUTHEAST; tdir++)
		{
			if (tdir != turnaround && attempts[tdir] == false)
			{
				actor->movedir = tdir;
				attempts[tdir] = true;
				if ( P_TryWalk(actor) )
					return;
			}
		}
	}
	else
	{
		for (tdir = DI_SOUTHEAST; tdir != (DI_EAST-1); tdir--)
		{
			if (tdir != turnaround && attempts[tdir] == false)
			{
				actor->movedir = tdir;
				attempts[tdir] = true;
				if ( P_TryWalk(actor) )
					return;
			}
		}
	}

	if (turnaround != DI_NODIR && attempts[turnaround] == false)
	{
		actor->movedir =turnaround;
		if ( P_TryWalk(actor) )
			return;
	}

	actor->movedir = DI_NODIR;	// cannot move
}